

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_sl.c
# Opt level: O0

sylvan_skiplist_t sylvan_skiplist_alloc(size_t size)

{
  sylvan_skiplist_t psVar1;
  sl_bucket *psVar2;
  sylvan_skiplist_t l;
  size_t size_local;
  
  if (0x7fffffff < size) {
    fprintf(_stderr,"sylvan: Trying to allocate a skiplist >= 0x80000000 buckets!\n");
    exit(1);
  }
  psVar1 = (sylvan_skiplist_t)malloc(0x18);
  psVar2 = (sl_bucket *)alloc_aligned(size << 6);
  psVar1->buckets = psVar2;
  if (psVar1->buckets == (sl_bucket *)0x0) {
    fprintf(_stderr,"sylvan: Unable to allocate virtual memory (%\'zu bytes) for the skiplist!\n",
            size << 6);
    exit(1);
  }
  psVar1->size = size;
  LOCK();
  psVar1->next = 1;
  UNLOCK();
  return psVar1;
}

Assistant:

sylvan_skiplist_t
sylvan_skiplist_alloc(size_t size)
{
    if (size >= 0x80000000) {
        fprintf(stderr, "sylvan: Trying to allocate a skiplist >= 0x80000000 buckets!\n");
        exit(1);
    }
    sylvan_skiplist_t l = malloc(sizeof(struct sylvan_skiplist));
    l->buckets = alloc_aligned(sizeof(sl_bucket) * size);
    if (l->buckets == 0) {
        fprintf(stderr, "sylvan: Unable to allocate virtual memory (%'zu bytes) for the skiplist!\n", size*sizeof(sl_bucket));
        exit(1);
    }
    l->size = size;
    l->next = 1;
    return l;
}